

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Performance::ShaderOptimizationTests::init
          (ShaderOptimizationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  uint uVar2;
  TestNode *node;
  TestNode *node_00;
  TestNode *pTVar3;
  TestNode *node_01;
  undefined8 *puVar4;
  long *plVar5;
  ShaderOptimizationCase *pSVar6;
  long *plVar7;
  ulong *puVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  string caseTypeName;
  string caseTypeDesc;
  string description;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream s;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  ulong *local_298;
  long local_290;
  ulong local_288;
  long lStack_280;
  ulong local_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  ShaderOptimizationTests *local_250;
  char *local_248;
  long *local_240;
  long local_238;
  long local_230;
  long lStack_228;
  ulong *local_220;
  long local_218;
  ulong local_210;
  long lStack_208;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0 [2];
  ShaderOptimizationCase *local_1e0;
  TestNode *local_1d8;
  TestNode *local_1d0;
  TestNode *local_1c8;
  TestNode *local_1c0;
  TestNode *local_1b8;
  TestNode *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  node = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,pCVar1->m_testCtx,"loop_unrolling","Loop Unrolling Cases");
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_021693d0;
  node[1]._vptr_TestNode = (_func_int **)pCVar1;
  node_00 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,pCVar1->m_testCtx,"loop_invariant_code_motion",
             "Loop-Invariant Code Motion Cases");
  node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_021693d0;
  node_00[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar3 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"function_inlining","Function Inlining Cases"
            );
  ((TestNode *)&pTVar3->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_021693d0;
  ((TestNode *)&pTVar3[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar1;
  local_1d8 = pTVar3;
  pTVar3 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"constant_propagation",
             "Constant Propagation Cases");
  ((TestNode *)&pTVar3->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_021693d0;
  ((TestNode *)&pTVar3[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar1;
  local_1d0 = pTVar3;
  pTVar3 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,pCVar1->m_testCtx,"common_subexpression_elimination",
             "Common Subexpression Elimination Cases");
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_021693d0;
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar1;
  node_01 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,pCVar1->m_testCtx,"dead_code_elimination",
             "Dead Code Elimination Cases");
  node_01->_vptr_TestNode = (_func_int **)&PTR__TestCase_021693d0;
  node_01[1]._vptr_TestNode = (_func_int **)pCVar1;
  local_1b0 = node;
  tcu::TestNode::addChild((TestNode *)this,node);
  local_1b8 = node_00;
  tcu::TestNode::addChild((TestNode *)this,node_00);
  tcu::TestNode::addChild((TestNode *)this,local_1d8);
  tcu::TestNode::addChild((TestNode *)this,local_1d0);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  local_250 = this;
  tcu::TestNode::addChild((TestNode *)this,node_01);
  local_278 = 0;
  local_1c8 = node_01;
  local_1c0 = pTVar3;
  do {
    local_248 = "_fragment";
    if ((int)local_278 == 0) {
      local_248 = "_vertex";
    }
    iVar10 = 0;
    do {
      pcVar12 = "dependent_iterations";
      if (iVar10 == 0) {
        pcVar12 = "independent_iterations";
      }
      local_2b8 = &local_2a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b8,pcVar12,pcVar12 + (ulong)(iVar10 == 0) * 2 + 0x14);
      pcVar12 = "loop iterations depend on each other";
      if (iVar10 == 0) {
        pcVar12 = "loop iterations don\'t depend on each other";
      }
      pcVar9 = pcVar12 + 0x24;
      if (iVar10 == 0) {
        pcVar9 = pcVar12 + 0x2a;
      }
      local_298 = &local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,pcVar12,pcVar9);
      lVar14 = 0;
      do {
        iVar11 = *(int *)((long)init()::callNestingDepths + lVar14);
        local_220 = &local_210;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_220,local_2b8,(long)local_2b8 + local_2b0);
        std::__cxx11::string::append((char *)&local_220);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar11);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar13 = 0xf;
        if (local_220 != &local_210) {
          uVar13 = local_210;
        }
        if (uVar13 < (ulong)(local_1f8 + local_218)) {
          uVar13 = 0xf;
          if (local_200 != local_1f0) {
            uVar13 = local_1f0[0];
          }
          if (uVar13 < (ulong)(local_1f8 + local_218)) goto LAB_01033d30;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_220);
        }
        else {
LAB_01033d30:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_200);
        }
        local_270 = &local_260;
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_260 = *plVar5;
          lStack_258 = puVar4[3];
        }
        else {
          local_260 = *plVar5;
          local_270 = (long *)*puVar4;
        }
        local_268 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_270);
        local_240 = &local_230;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_230 = *plVar7;
          lStack_228 = plVar5[3];
        }
        else {
          local_230 = *plVar7;
          local_240 = (long *)*plVar5;
        }
        local_238 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if (local_200 != local_1f0) {
          operator_delete(local_200,local_1f0[0] + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar11);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_200);
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_210 = *puVar8;
          lStack_208 = plVar5[3];
          local_220 = &local_210;
        }
        else {
          local_210 = *puVar8;
          local_220 = (ulong *)*plVar5;
        }
        local_218 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_298);
        local_270 = &local_260;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_260 = *plVar7;
          lStack_258 = plVar5[3];
        }
        else {
          local_260 = *plVar7;
          local_270 = (long *)*plVar5;
        }
        local_268 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_200 != local_1f0) {
          operator_delete(local_200,local_1f0[0] + 1);
        }
        pSVar6 = (ShaderOptimizationCase *)operator_new(0x358);
        anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                  (pSVar6,(local_250->super_TestCaseGroup).m_context,(char *)local_240,
                   (char *)local_270,(CaseShaderType)local_278);
        (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ShaderOptimizationCase_0217dff0;
        *(int *)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar11;
        *(int *)((long)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
             iVar10;
        tcu::TestNode::addChild(local_1b0,(TestNode *)pSVar6);
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,local_230 + 1);
        }
        lVar14 = lVar14 + 4;
      } while (lVar14 != 0xc);
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      bVar15 = iVar10 == 0;
      iVar10 = iVar10 + 1;
    } while (bVar15);
    lVar14 = 0;
    do {
      iVar10 = *(int *)((long)init()::callNestingDepths + lVar14);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_240);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_288 = *puVar8;
        lStack_280 = plVar5[3];
        local_298 = &local_288;
      }
      else {
        local_288 = *puVar8;
        local_298 = (ulong *)*plVar5;
      }
      local_290 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_2b8 = &local_2a8;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_2a8 = *plVar7;
        lStack_2a0 = plVar5[3];
      }
      else {
        local_2a8 = *plVar7;
        local_2b8 = (long *)*plVar5;
      }
      local_2b0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240,local_230 + 1);
      }
      pSVar6 = (ShaderOptimizationCase *)operator_new(0x358);
      anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                (pSVar6,(local_250->super_TestCaseGroup).m_context,(char *)local_2b8,
                 glcts::fixed_sample_locations_values + 1,(CaseShaderType)local_278);
      (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderOptimizationCase_0217e0a0;
      *(int *)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar10;
      tcu::TestNode::addChild(local_1b8,(TestNode *)pSVar6);
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0xc);
    lVar14 = 0;
    do {
      iVar10 = *(int *)((long)init()::callNestingDepths + lVar14);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_240);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_288 = *puVar8;
        lStack_280 = plVar5[3];
        local_298 = &local_288;
      }
      else {
        local_288 = *puVar8;
        local_298 = (ulong *)*plVar5;
      }
      local_290 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_2b8 = &local_2a8;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_2a8 = *plVar7;
        lStack_2a0 = plVar5[3];
      }
      else {
        local_2a8 = *plVar7;
        local_2b8 = (long *)*plVar5;
      }
      local_2b0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240,local_230 + 1);
      }
      pSVar6 = (ShaderOptimizationCase *)operator_new(0x358);
      anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                (pSVar6,(local_250->super_TestCaseGroup).m_context,(char *)local_2b8,
                 glcts::fixed_sample_locations_values + 1,(CaseShaderType)local_278);
      (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderOptimizationCase_0217e0f8;
      *(int *)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar10;
      tcu::TestNode::addChild(local_1d8,(TestNode *)pSVar6);
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0xc);
    iVar10 = 0;
    do {
      pcVar12 = "built_in_functions";
      if (iVar10 != 0) {
        if (iVar10 == 1) {
          pcVar12 = "array";
        }
        else {
          pcVar12 = (char *)0x0;
          if (iVar10 == 2) {
            pcVar12 = "struct";
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,pcVar12,(allocator<char> *)&local_2b8);
      iVar11 = 0;
      do {
        local_298 = &local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_1a8,(long)local_1a8 + local_1a0);
        std::__cxx11::string::append((char *)&local_298);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_298);
        local_2b8 = &local_2a8;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_2a8 = *plVar7;
          lStack_2a0 = plVar5[3];
        }
        else {
          local_2a8 = *plVar7;
          local_2b8 = (long *)*plVar5;
        }
        local_2b0 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_298 != &local_288) {
          operator_delete(local_298,local_288 + 1);
        }
        if (iVar10 != 1 || iVar11 == 0) {
          pSVar6 = (ShaderOptimizationCase *)operator_new(0x358);
          anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                    (pSVar6,(local_250->super_TestCaseGroup).m_context,(char *)local_2b8,
                     glcts::fixed_sample_locations_values + 1,(CaseShaderType)local_278);
          (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__ShaderOptimizationCase_0217e150;
          *(int *)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar10;
          *(char *)((long)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4
                   ) = (char)iVar11;
          tcu::TestNode::addChild(local_1d0,(TestNode *)pSVar6);
        }
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8,local_2a8 + 1);
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 == 1);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != 3);
    iVar10 = 0;
    do {
      pcVar12 = "single_statement";
      if ((iVar10 != 0) && (pcVar12 = "multiple_statements", iVar10 != 1)) {
        if (iVar10 == 2) {
          pcVar12 = "static_branch";
        }
        else {
          pcVar12 = (char *)0x0;
          if (iVar10 == 3) {
            pcVar12 = "loop";
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,pcVar12,(allocator<char> *)&local_2b8);
      pcVar12 = "A single statement containing multiple uses of same subexpression";
      if ((iVar10 != 0) &&
         (pcVar12 = "Multiple statements performing same computations", iVar10 != 1)) {
        if (iVar10 == 2) {
          pcVar12 = "Multiple statements including a static conditional";
        }
        else {
          pcVar12 = (char *)0x0;
          if (iVar10 == 3) {
            pcVar12 = "Multiple loops performing the same computations";
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,pcVar12,(allocator<char> *)&local_298);
      pSVar6 = (ShaderOptimizationCase *)operator_new(0x358);
      pCVar1 = (local_250->super_TestCaseGroup).m_context;
      local_298 = &local_288;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_1a8,(long)local_1a8 + local_1a0);
      std::__cxx11::string::append((char *)&local_298);
      anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                (pSVar6,pCVar1,(char *)local_298,(char *)local_2b8,(CaseShaderType)local_278);
      (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderOptimizationCase_0217e1a8;
      *(int *)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar10;
      tcu::TestNode::addChild(local_1c0,(TestNode *)pSVar6);
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != 4);
    lVar14 = 0;
    do {
      uVar2 = (uint)lVar14;
      pcVar12 = 
      "Do computation inside a branch that is never taken (condition is simple false constant expression)"
      ;
      if (uVar2 != 0) {
        if (uVar2 < 8) {
          pcVar12 = (char *)((long)&DAT_01c2a3a8 + (long)(int)(&DAT_01c2a3a4)[lVar14]);
        }
        else {
          pcVar12 = (char *)0x0;
          if (uVar2 == 8) {
            pcVar12 = "Compute a value that is used but multiplied by a zero constant expression";
          }
        }
      }
      local_1e0 = (ShaderOptimizationCase *)operator_new(0x358);
      pCVar1 = (local_250->super_TestCaseGroup).m_context;
      local_298 = &local_288;
      local_290 = 0;
      local_288 = local_288 & 0xffffffffffffff00;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_2b8 = &local_2a8;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_2a8 = *plVar7;
        lStack_2a0 = plVar5[3];
      }
      else {
        local_2a8 = *plVar7;
        local_2b8 = (long *)*plVar5;
      }
      local_2b0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      pSVar6 = local_1e0;
      local_1a8 = &local_198;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_198 = *plVar7;
        lStack_190 = plVar5[3];
      }
      else {
        local_198 = *plVar7;
        local_1a8 = (long *)*plVar5;
      }
      local_1a0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                (local_1e0,pCVar1,(char *)local_1a8,pcVar12,(CaseShaderType)local_278);
      (pSVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderOptimizationCase_0217e200;
      *(uint *)&pSVar6[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar2;
      tcu::TestNode::addChild(local_1c8,(TestNode *)pSVar6);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      lVar14 = lVar14 + 1;
    } while ((int)lVar14 != 9);
    iVar10 = (int)local_278;
    uVar2 = iVar10 + 1;
    local_278 = (ulong)uVar2;
    if (iVar10 != 0) {
      return uVar2;
    }
  } while( true );
}

Assistant:

void ShaderOptimizationTests::init (void)
{
	TestCaseGroup* const unrollGroup					= new TestCaseGroup(m_context, "loop_unrolling",					"Loop Unrolling Cases");
	TestCaseGroup* const loopInvariantCodeMotionGroup	= new TestCaseGroup(m_context, "loop_invariant_code_motion",		"Loop-Invariant Code Motion Cases");
	TestCaseGroup* const inlineGroup					= new TestCaseGroup(m_context, "function_inlining",					"Function Inlining Cases");
	TestCaseGroup* const constantPropagationGroup		= new TestCaseGroup(m_context, "constant_propagation",				"Constant Propagation Cases");
	TestCaseGroup* const commonSubexpressionGroup		= new TestCaseGroup(m_context, "common_subexpression_elimination",	"Common Subexpression Elimination Cases");
	TestCaseGroup* const deadCodeEliminationGroup		= new TestCaseGroup(m_context, "dead_code_elimination",				"Dead Code Elimination Cases");
	addChild(unrollGroup);
	addChild(loopInvariantCodeMotionGroup);
	addChild(inlineGroup);
	addChild(constantPropagationGroup);
	addChild(commonSubexpressionGroup);
	addChild(deadCodeEliminationGroup);

	for (int caseShaderTypeI = 0; caseShaderTypeI < CASESHADERTYPE_LAST; caseShaderTypeI++)
	{
		const CaseShaderType	caseShaderType			= (CaseShaderType)caseShaderTypeI;
		const char* const		caseShaderTypeSuffix	= caseShaderType == CASESHADERTYPE_VERTEX		? "_vertex"
														: caseShaderType == CASESHADERTYPE_FRAGMENT		? "_fragment"
														: DE_NULL;

		// Loop unrolling cases.

		{
			static const int loopIterationCounts[] = { 4, 8, 32 };

			for (int caseTypeI = 0; caseTypeI < LoopUnrollCase::CASETYPE_LAST; caseTypeI++)
			{
				const LoopUnrollCase::CaseType	caseType		= (LoopUnrollCase::CaseType)caseTypeI;
				const string					caseTypeName	= caseType == LoopUnrollCase::CASETYPE_INDEPENDENT	? "independent_iterations"
																: caseType == LoopUnrollCase::CASETYPE_DEPENDENT	? "dependent_iterations"
																: DE_NULL;
				const string					caseTypeDesc	= caseType == LoopUnrollCase::CASETYPE_INDEPENDENT	? "loop iterations don't depend on each other"
																: caseType == LoopUnrollCase::CASETYPE_DEPENDENT	? "loop iterations depend on each other"
																: DE_NULL;

				for (int loopIterNdx = 0; loopIterNdx < DE_LENGTH_OF_ARRAY(loopIterationCounts); loopIterNdx++)
				{
					const int			loopIterations	= loopIterationCounts[loopIterNdx];
					const string		name			= caseTypeName + "_" + toString(loopIterations) + caseShaderTypeSuffix;
					const string		description		= toString(loopIterations) + " iterations; " + caseTypeDesc;

					unrollGroup->addChild(new LoopUnrollCase(m_context, name.c_str(), description.c_str(), caseShaderType, caseType, loopIterations));
				}
			}
		}

		// Loop-invariant code motion cases.

		{
			static const int loopIterationCounts[] = { 4, 8, 32 };

			for (int loopIterNdx = 0; loopIterNdx < DE_LENGTH_OF_ARRAY(loopIterationCounts); loopIterNdx++)
			{
				const int		loopIterations	= loopIterationCounts[loopIterNdx];
				const string	name			= toString(loopIterations) + "_iterations" + caseShaderTypeSuffix;

				loopInvariantCodeMotionGroup->addChild(new LoopInvariantCodeMotionCase(m_context, name.c_str(), "", caseShaderType, loopIterations));
			}
		}

		// Function inlining cases.

		{
			static const int callNestingDepths[] = { 4, 8, 32 };

			for (int nestDepthNdx = 0; nestDepthNdx < DE_LENGTH_OF_ARRAY(callNestingDepths); nestDepthNdx++)
			{
				const int		nestingDepth	= callNestingDepths[nestDepthNdx];
				const string	name			= toString(nestingDepth) + "_nested" + caseShaderTypeSuffix;

				inlineGroup->addChild(new FunctionInliningCase(m_context, name.c_str(), "", caseShaderType, nestingDepth));
			}
		}

		// Constant propagation cases.

		for (int caseTypeI = 0; caseTypeI < ConstantPropagationCase::CASETYPE_LAST; caseTypeI++)
		{
			const ConstantPropagationCase::CaseType		caseType		= (ConstantPropagationCase::CaseType)caseTypeI;
			const string								caseTypeName	= caseType == ConstantPropagationCase::CASETYPE_BUILT_IN_FUNCTIONS		? "built_in_functions"
																		: caseType == ConstantPropagationCase::CASETYPE_ARRAY					? "array"
																		: caseType == ConstantPropagationCase::CASETYPE_STRUCT					? "struct"
																		: DE_NULL;

			for (int constantExpressionsOnlyI = 0; constantExpressionsOnlyI <= 1; constantExpressionsOnlyI++)
			{
				const bool		constantExpressionsOnly		= constantExpressionsOnlyI != 0;
				const string	name						= caseTypeName + (constantExpressionsOnly ? "" : "_no_const") + caseShaderTypeSuffix;

				if (caseType == ConstantPropagationCase::CASETYPE_ARRAY && constantExpressionsOnly) // \note See ConstantPropagationCase's constructor for explanation.
					continue;

				constantPropagationGroup->addChild(new ConstantPropagationCase(m_context, name.c_str(), "", caseShaderType, caseType, constantExpressionsOnly));
			}
		}

		// Common subexpression cases.

		for (int caseTypeI = 0; caseTypeI < CommonSubexpressionCase::CASETYPE_LAST; caseTypeI++)
		{
			const CommonSubexpressionCase::CaseType		caseType		= (CommonSubexpressionCase::CaseType)caseTypeI;

			const string								caseTypeName	= caseType == CommonSubexpressionCase::CASETYPE_SINGLE_STATEMENT		? "single_statement"
																		: caseType == CommonSubexpressionCase::CASETYPE_MULTIPLE_STATEMENTS		? "multiple_statements"
																		: caseType == CommonSubexpressionCase::CASETYPE_STATIC_BRANCH			? "static_branch"
																		: caseType == CommonSubexpressionCase::CASETYPE_LOOP					? "loop"
																		: DE_NULL;

			const string								description		= caseType == CommonSubexpressionCase::CASETYPE_SINGLE_STATEMENT		? "A single statement containing multiple uses of same subexpression"
																		: caseType == CommonSubexpressionCase::CASETYPE_MULTIPLE_STATEMENTS		? "Multiple statements performing same computations"
																		: caseType == CommonSubexpressionCase::CASETYPE_STATIC_BRANCH			? "Multiple statements including a static conditional"
																		: caseType == CommonSubexpressionCase::CASETYPE_LOOP					? "Multiple loops performing the same computations"
																		: DE_NULL;

			commonSubexpressionGroup->addChild(new CommonSubexpressionCase(m_context, (caseTypeName + caseShaderTypeSuffix).c_str(), description.c_str(), caseShaderType, caseType));
		}

		// Dead code elimination cases.

		for (int caseTypeI = 0; caseTypeI < DeadCodeEliminationCase::CASETYPE_LAST; caseTypeI++)
		{
			const DeadCodeEliminationCase::CaseType		caseType				= (DeadCodeEliminationCase::CaseType)caseTypeI;
			const char* const							caseTypeName			= caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_SIMPLE				? "dead_branch_simple"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX				? "dead_branch_complex"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? "dead_branch_complex_no_const"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_FUNC_CALL			? "dead_branch_func_call"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_BASIC				? "unused_value_basic"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_LOOP				? "unused_value_loop"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? "unused_value_dead_branch"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_AFTER_RETURN		? "unused_value_after_return"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_MUL_ZERO			? "unused_value_mul_zero"
																				: DE_NULL;

			const char* const							caseTypeDescription		= caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_SIMPLE				? "Do computation inside a branch that is never taken (condition is simple false constant expression)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX				? "Do computation inside a branch that is never taken (condition is complex false constant expression)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? "Do computation inside a branch that is never taken (condition is complex false expression, not constant expression but still compile-time computable)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_FUNC_CALL			? "Do computation inside a branch that is never taken (condition is compile-time computable false expression containing function call to a simple inlineable function)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_BASIC				? "Compute a value that is never used even statically"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_LOOP				? "Compute a value, using a loop, that is never used even statically"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? "Compute a value that is used only inside a statically dead branch"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_AFTER_RETURN		? "Compute a value that is used only after a return statement"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_MUL_ZERO			? "Compute a value that is used but multiplied by a zero constant expression"
																				: DE_NULL;

			deadCodeEliminationGroup->addChild(new DeadCodeEliminationCase(m_context, (string() + caseTypeName + caseShaderTypeSuffix).c_str(), caseTypeDescription, caseShaderType, caseType));
		}
	}
}